

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

void duckdb::DecimalRoundNegativePrecisionFunction<int,duckdb::NumericHelper>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  int iVar1;
  int iVar2;
  idx_t count;
  int *piVar3;
  int *piVar4;
  unsigned_long *puVar5;
  data_ptr_t pdVar6;
  ulong uVar7;
  sel_t *psVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  byte bVar11;
  byte bVar12;
  int iVar13;
  BoundFunctionExpression *pBVar14;
  pointer pFVar15;
  const_reference pvVar16;
  pointer pEVar17;
  reference vector;
  TemplatedValidityData<unsigned_long> *pTVar18;
  _Head_base<0UL,_unsigned_long_*,_false> _Var19;
  idx_t iVar20;
  ulong uVar21;
  idx_t iVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  idx_t idx_in_entry;
  ulong uVar26;
  int iVar27;
  data_ptr_t pdVar28;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  data_ptr_t local_90;
  buffer_ptr<ValidityBuffer> *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  pBVar14 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  pFVar15 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->(&pBVar14->bind_info);
  pvVar16 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](&pBVar14->children,0);
  pEVar17 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar16);
  bVar11 = DecimalType::GetScale(&pEVar17->return_type);
  pvVar16 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](&pBVar14->children,0);
  pEVar17 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar16);
  bVar12 = DecimalType::GetWidth(&pEVar17->return_type);
  iVar1 = *(int *)&pFVar15[1]._vptr_FunctionData;
  if ((int)((uint)bVar11 - (uint)bVar12) < iVar1) {
    iVar2 = *(int *)(NumericHelper::POWERS_OF_TEN + (long)(int)((uint)bVar11 - iVar1) * 8);
    iVar1 = *(int *)(NumericHelper::POWERS_OF_TEN + (long)iVar1 * -8);
    iVar27 = iVar2 / 2;
    vector = vector<duckdb::Vector,_true>::operator[](&input->data,0);
    count = input->count;
    if (vector->vector_type == FLAT_VECTOR) {
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar28 = result->data;
      pdVar6 = vector->data;
      FlatVector::VerifyFlatVector(vector);
      FlatVector::VerifyFlatVector(result);
      puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        if (count != 0) {
          iVar22 = 0;
          do {
            iVar13 = iVar27;
            if (*(int *)(pdVar6 + iVar22 * 4) < 0) {
              iVar13 = -iVar27;
            }
            *(int *)(pdVar28 + iVar22 * 4) =
                 ((iVar13 + *(int *)(pdVar6 + iVar22 * 4)) / iVar2) * iVar1;
            iVar22 = iVar22 + 1;
          } while (count != iVar22);
        }
      }
      else {
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar5;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if (0x3f < count + 0x3f) {
          puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          uVar23 = 0;
          uVar26 = 0;
          do {
            if (puVar5 == (unsigned_long *)0x0) {
              uVar24 = uVar26 + 0x40;
              if (count <= uVar26 + 0x40) {
                uVar24 = count;
              }
LAB_01aa2914:
              uVar25 = uVar26;
              if (uVar26 < uVar24) {
                do {
                  iVar13 = iVar27;
                  if (*(int *)(pdVar6 + uVar26 * 4) < 0) {
                    iVar13 = -iVar27;
                  }
                  *(int *)(pdVar28 + uVar26 * 4) =
                       ((iVar13 + *(int *)(pdVar6 + uVar26 * 4)) / iVar2) * iVar1;
                  uVar26 = uVar26 + 1;
                  uVar25 = uVar24;
                } while (uVar24 != uVar26);
              }
            }
            else {
              uVar7 = puVar5[uVar23];
              uVar24 = uVar26 + 0x40;
              if (count <= uVar26 + 0x40) {
                uVar24 = count;
              }
              uVar25 = uVar24;
              if (uVar7 != 0) {
                if (uVar7 == 0xffffffffffffffff) goto LAB_01aa2914;
                uVar25 = uVar26;
                if (uVar26 < uVar24) {
                  uVar21 = 0;
                  do {
                    if ((uVar7 >> (uVar21 & 0x3f) & 1) != 0) {
                      iVar13 = iVar27;
                      if (*(int *)(pdVar6 + uVar21 * 4 + uVar26 * 4) < 0) {
                        iVar13 = -iVar27;
                      }
                      *(int *)(pdVar28 + uVar21 * 4 + uVar26 * 4) =
                           ((iVar13 + *(int *)(pdVar6 + uVar21 * 4 + uVar26 * 4)) / iVar2) * iVar1;
                    }
                    uVar21 = uVar21 + 1;
                    uVar25 = uVar24;
                  } while (uVar24 - uVar26 != uVar21);
                }
              }
            }
            uVar23 = uVar23 + 1;
            uVar26 = uVar25;
          } while (uVar23 != count + 0x3f >> 6);
        }
      }
    }
    else if (vector->vector_type == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      piVar3 = (int *)result->data;
      piVar4 = (int *)vector->data;
      puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      iVar13 = -iVar27;
      if (-1 < *piVar4) {
        iVar13 = iVar27;
      }
      *piVar3 = ((iVar13 + *piVar4) / iVar2) * iVar1;
    }
    else {
      UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
      Vector::ToUnifiedFormat(vector,count,&local_78);
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar28 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (count != 0) {
          psVar8 = (local_78.sel)->sel_vector;
          iVar22 = 0;
          do {
            iVar20 = iVar22;
            if (psVar8 != (sel_t *)0x0) {
              iVar20 = (idx_t)psVar8[iVar22];
            }
            iVar13 = iVar27;
            if (*(int *)(local_78.data + iVar20 * 4) < 0) {
              iVar13 = -iVar27;
            }
            *(int *)(pdVar28 + iVar22 * 4) =
                 ((iVar13 + *(int *)(local_78.data + iVar20 * 4)) / iVar2) * iVar1;
            iVar22 = iVar22 + 1;
          } while (count != iVar22);
        }
      }
      else if (count != 0) {
        psVar8 = (local_78.sel)->sel_vector;
        local_88 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        uVar26 = 0;
        local_90 = pdVar28;
        do {
          uVar23 = uVar26;
          if (psVar8 != (sel_t *)0x0) {
            uVar23 = (ulong)psVar8[uVar26];
          }
          if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar23 >> 6] >> (uVar23 & 0x3f) & 1) == 0) {
            _Var19._M_head_impl =
                 (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (_Var19._M_head_impl == (unsigned_long *)0x0) {
              local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_a8,&local_80);
              p_Var10 = p_Stack_a0;
              peVar9 = local_a8;
              local_a8 = (element_type *)0x0;
              p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar9;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var10;
              if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
                 p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
              }
              pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_88);
              _Var19._M_head_impl =
                   (pTVar18->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var19._M_head_impl;
              pdVar28 = local_90;
            }
            bVar11 = (byte)uVar26 & 0x3f;
            _Var19._M_head_impl[uVar26 >> 6] =
                 _Var19._M_head_impl[uVar26 >> 6] &
                 (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
          }
          else {
            iVar13 = iVar27;
            if (*(int *)(local_78.data + uVar23 * 4) < 0) {
              iVar13 = -iVar27;
            }
            *(int *)(pdVar28 + uVar26 * 4) =
                 ((iVar13 + *(int *)(local_78.data + uVar23 * 4)) / iVar2) * iVar1;
          }
          uVar26 = uVar26 + 1;
        } while (count != uVar26);
      }
      if (local_78.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
  }
  else {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    Value::INTEGER((Value *)&local_78,0);
    Vector::SetValue(result,0,(Value *)&local_78);
    Value::~Value((Value *)&local_78);
  }
  return;
}

Assistant:

static void DecimalRoundNegativePrecisionFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RoundPrecisionFunctionData>();
	auto source_scale = DecimalType::GetScale(func_expr.children[0]->return_type);
	auto width = DecimalType::GetWidth(func_expr.children[0]->return_type);
	if (info.target_scale <= -int32_t(width - source_scale)) {
		// scale too big for width
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		result.SetValue(0, Value::INTEGER(0));
		return;
	}
	T divide_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale + source_scale]);
	T multiply_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale]);
	T addition = divide_power_of_ten / 2;

	UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
		if (input < 0) {
			input -= addition;
		} else {
			input += addition;
		}
		return UnsafeNumericCast<T>(input / divide_power_of_ten * multiply_power_of_ten);
	});
}